

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_system.c
# Opt level: O0

void apu_cpu_bus(nes_system *system)

{
  nes_system_state *state;
  nes_system *system_local;
  
  if (((system->state).cpu.rw_mode == '\x01') && ((system->state).cpu.address == 0x4015)) {
    (system->state).cpu.data = (system->state).apu.reg_data;
    (system->state).cached_apuio_reg[0x15] = (system->state).cpu.data;
    if ((system->config).memory_callback !=
        (_func_void_nes_memory_type_nes_memory_op_uint16_t_uint8_t_ptr_void_ptr *)0x0) {
      (*(system->config).memory_callback)
                (NES_MEMORY_TYPE_CPU,NES_MEMORY_OP_READ,(system->state).cpu.address,
                 &(system->state).cpu.data,(system->config).client_data);
    }
  }
  return;
}

Assistant:

static void apu_cpu_bus(nes_system* system)
{
    nes_system_state* state = &system->state;

    if (state->cpu.rw_mode == CPU_RW_MODE_READ && state->cpu.address == 0x4015)
    {
        state->cpu.data = state->apu.reg_data;
        state->cached_apuio_reg[0x15] = state->cpu.data;

        if (system->config.memory_callback)
            system->config.memory_callback(NES_MEMORY_TYPE_CPU, NES_MEMORY_OP_READ, state->cpu.address, &state->cpu.data, system->config.client_data);
    }
}